

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosXMLUtil.cpp
# Opt level: O2

unique_ptr<pugi::xml_document,_std::default_delete<pugi::xml_document>_> __thiscall
adios2::helper::XMLDocument(helper *this,string *xmlContents,string *hint)

{
  bool bVar1;
  xml_document *this_00;
  char *pcVar2;
  allocator local_11c;
  allocator local_11b;
  allocator local_11a;
  allocator local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  xml_parse_result parse_result;
  
  this_00 = (xml_document *)operator_new(0xd0);
  pugi::xml_document::xml_document(this_00);
  *(xml_document **)this = this_00;
  pugi::xml_document::load_buffer_inplace
            (&parse_result,this_00,(xmlContents->_M_dataplus)._M_p,xmlContents->_M_string_length,
             0x74,encoding_auto);
  bVar1 = pugi::xml_parse_result::operator_cast_to_bool(&parse_result);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_58,"Helper",&local_119);
    std::__cxx11::string::string((string *)&local_78,"adiosXMLUtil",&local_11a);
    std::__cxx11::string::string((string *)&local_98,"XMLDocument",&local_11b);
    pcVar2 = pugi::xml_parse_result::description(&parse_result);
    std::__cxx11::string::string((string *)&local_118,pcVar2,&local_11c);
    std::operator+(&local_f8,"parse error in XML string, description: ",&local_118);
    std::operator+(&local_d8,&local_f8,", check with any XML editor if format is ill-formed, ");
    std::operator+(&local_b8,&local_d8,hint);
    Throw<std::invalid_argument>(&local_58,&local_78,&local_98,&local_b8,-1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return (__uniq_ptr_data<pugi::xml_document,_std::default_delete<pugi::xml_document>,_true,_true>)
         (__uniq_ptr_data<pugi::xml_document,_std::default_delete<pugi::xml_document>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<pugi::xml_document> XMLDocument(const std::string &xmlContents,
                                                const std::string hint)
{
    std::unique_ptr<pugi::xml_document> document(new pugi::xml_document);
    auto parse_result =
        document->load_buffer_inplace(const_cast<char *>(xmlContents.data()), xmlContents.size());

    if (!parse_result)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosXMLUtil", "XMLDocument",
            "parse error in XML string, description: " + std::string(parse_result.description()) +
                ", check with any XML editor if format is ill-formed, " + hint);
    }
    return document;
}